

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# division_operations.c
# Opt level: O0

int32_t WebRtcSpl_DivW32HiLow(int32_t num,int16_t den_hi,int16_t den_low)

{
  short sVar1;
  short sVar2;
  int32_t iVar3;
  int iVar4;
  int32_t tmpW32;
  int16_t num_low;
  int16_t num_hi;
  int16_t tmp_low;
  int16_t tmp_hi;
  int16_t approx;
  int16_t den_low_local;
  int16_t den_hi_local;
  int32_t num_local;
  
  iVar3 = WebRtcSpl_DivW32W16(0x1fffffff,den_hi);
  sVar1 = (short)iVar3;
  iVar4 = 0x7fffffff - ((int)den_hi * (int)sVar1 * 2 + ((int)den_low * (int)sVar1 >> 0xf) * 2);
  sVar2 = (short)((uint)iVar4 >> 0x10);
  iVar4 = ((int)sVar2 * (int)sVar1 +
          ((int)(short)(iVar4 + sVar2 * -0x10000 >> 1) * (int)sVar1 >> 0xf)) * 2;
  sVar1 = (short)((uint)iVar4 >> 0x10);
  sVar2 = (short)((uint)num >> 0x10);
  return ((int)sVar2 * (int)sVar1 +
          ((int)sVar2 * (int)(short)(iVar4 + sVar1 * -0x10000 >> 1) >> 0xf) +
         ((int)(short)(num + sVar2 * -0x10000 >> 1) * (int)sVar1 >> 0xf)) * 8;
}

Assistant:

int32_t WebRtcSpl_DivW32HiLow(int32_t num, int16_t den_hi, int16_t den_low)
{
    int16_t approx, tmp_hi, tmp_low, num_hi, num_low;
    int32_t tmpW32;

    approx = (int16_t)WebRtcSpl_DivW32W16((int32_t)0x1FFFFFFF, den_hi);
    // result in Q14 (Note: 3FFFFFFF = 0.5 in Q30)

    // tmpW32 = 1/den = approx * (2.0 - den * approx) (in Q30)
    tmpW32 = (den_hi * approx << 1) + ((den_low * approx >> 15) << 1);
    // tmpW32 = den * approx

    tmpW32 = (int32_t)0x7fffffffL - tmpW32; // result in Q30 (tmpW32 = 2.0-(den*approx))

    // Store tmpW32 in hi and low format
    tmp_hi = (int16_t)(tmpW32 >> 16);
    tmp_low = (int16_t)((tmpW32 - ((int32_t)tmp_hi << 16)) >> 1);

    // tmpW32 = 1/den in Q29
    tmpW32 = (tmp_hi * approx + (tmp_low * approx >> 15)) << 1;

    // 1/den in hi and low format
    tmp_hi = (int16_t)(tmpW32 >> 16);
    tmp_low = (int16_t)((tmpW32 - ((int32_t)tmp_hi << 16)) >> 1);

    // Store num in hi and low format
    num_hi = (int16_t)(num >> 16);
    num_low = (int16_t)((num - ((int32_t)num_hi << 16)) >> 1);

    // num * (1/den) by 32 bit multiplication (result in Q28)

    tmpW32 = num_hi * tmp_hi + (num_hi * tmp_low >> 15) +
        (num_low * tmp_hi >> 15);

    // Put result in Q31 (convert from Q28)
    tmpW32 = WEBRTC_SPL_LSHIFT_W32(tmpW32, 3);

    return tmpW32;
}